

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

int vector_equal(vector_t *vec1,vector_t *vec2)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = vec1->size;
  uVar3 = 0;
  if (uVar1 == vec2->size) {
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      if (uVar1 == uVar4) break;
      uVar2 = uVar4 + 1;
    } while (vec1->values[uVar4] == vec2->values[uVar4]);
    uVar3 = (uint)(uVar1 <= uVar4);
  }
  return uVar3;
}

Assistant:

int vector_equal(struct vector_t *vec1, struct vector_t *vec2)
{
  if (vec1->size != vec2->size)
    return 0;
  for (size_t i = 0; i < vec1->size; i++)
    if (vec1->values[i] != vec2->values[i])
      return 0;
  return 1;
}